

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O0

_HashNode * __thiscall SQTable::_Get(SQTable *this,SQObjectPtr *key,SQHash hash)

{
  _HashNode *local_30;
  _HashNode *n;
  SQHash hash_local;
  SQObjectPtr *key_local;
  SQTable *this_local;
  
  local_30 = this->_nodes + hash;
  while (((local_30->key).super_SQObject._unVal.pTable != (key->super_SQObject)._unVal.pTable ||
         ((local_30->key).super_SQObject._type != (key->super_SQObject)._type))) {
    local_30 = local_30->next;
    if (local_30 == (_HashNode *)0x0) {
      return (_HashNode *)0x0;
    }
  }
  return local_30;
}

Assistant:

inline _HashNode *_Get(const SQObjectPtr &key,SQHash hash)
    {
        _HashNode *n = &_nodes[hash];
        do{
            if(_rawval(n->key) == _rawval(key) && type(n->key) == type(key)){
                return n;
            }
        }while((n = n->next));
        return NULL;
    }